

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O2

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   *B)

{
  uint *puVar1;
  mapped_type *pmVar2;
  pointer pfVar3;
  uint *puVar4;
  ulong uVar5;
  key_type local_3c;
  mapped_type local_38;
  
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize(B,((long)(A->
                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(A->
                   super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pfVar3 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(A->
                             super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) / 0x18);
      uVar5 = uVar5 + 1) {
    puVar1 = *(uint **)&pfVar3[uVar5].m_flat_tree.m_data.m_seq;
    for (puVar4 = puVar1;
        puVar4 != puVar1 + *(stored_size_type *)((long)&pfVar3[uVar5].m_flat_tree.m_data.m_seq + 8)
                           * 4; puVar4 = puVar4 + 4) {
      local_38 = *(mapped_type *)(puVar4 + 2);
      local_3c = (key_type)uVar5;
      pmVar2 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
               priv_subscript((B->
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + *puVar4,&local_3c);
      *pmVar2 = local_38;
      pfVar3 = (A->
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = *(uint **)&pfVar3[uVar5].m_flat_tree.m_data.m_seq;
    }
  }
  do_nothing(B);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}